

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompts.c
# Opt level: O3

void free_prompts(prompts_t *p)

{
  prompt_t *ptr;
  ulong uVar1;
  
  if (p->ldisc_ptr_to_us != (prompts_t **)0x0) {
    *p->ldisc_ptr_to_us = (prompts_t *)0x0;
  }
  if (p->n_prompts != 0) {
    uVar1 = 0;
    do {
      ptr = p->prompts[uVar1];
      strbuf_free(ptr->result);
      safefree(ptr->prompt);
      safefree(ptr);
      uVar1 = uVar1 + 1;
    } while (uVar1 < p->n_prompts);
  }
  safefree(p->prompts);
  safefree(p->name);
  safefree(p->instruction);
  safefree(p);
  return;
}

Assistant:

void free_prompts(prompts_t *p)
{
    size_t i;

    /* If an Ldisc currently knows about us, tell it to forget us, so
     * it won't dereference a stale pointer later. */
    if (p->ldisc_ptr_to_us)
        *p->ldisc_ptr_to_us = NULL;

    for (i=0; i < p->n_prompts; i++) {
        prompt_t *pr = p->prompts[i];
        strbuf_free(pr->result);
        sfree(pr->prompt);
        sfree(pr);
    }
    sfree(p->prompts);
    sfree(p->name);
    sfree(p->instruction);
    sfree(p);
}